

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O3

void csp_eth_arp_set_addr(uint8_t *mac_addr,uint16_t csp_addr)

{
  arp_list_entry_t *paVar1;
  size_t sVar2;
  arp_list_entry_t *paVar3;
  arp_list_entry_t *paVar4;
  arp_list_entry_s **ppaVar5;
  
  sVar2 = arp_used;
  paVar3 = arp_list;
  if (arp_list == (arp_list_entry_t *)0x0) {
    paVar4 = (arp_list_entry_t *)0x0;
  }
  else {
    do {
      paVar4 = paVar3;
      if (paVar4->csp_addr == csp_addr) {
        return;
      }
      paVar3 = paVar4->next;
    } while (paVar4->next != (arp_list_entry_s *)0x0);
  }
  if (9 < arp_used) {
    return;
  }
  paVar3 = arp_array + arp_used;
  paVar1 = arp_array + arp_used;
  arp_used = arp_used + 1;
  paVar1->csp_addr = csp_addr;
  *(undefined4 *)arp_array[sVar2].mac_addr = *(undefined4 *)mac_addr;
  *(undefined2 *)(arp_array[sVar2].mac_addr + 4) = *(undefined2 *)(mac_addr + 4);
  arp_array[sVar2].next = (arp_list_entry_s *)0x0;
  ppaVar5 = &arp_list;
  if (paVar4 != (arp_list_entry_t *)0x0) {
    ppaVar5 = &paVar4->next;
  }
  *ppaVar5 = paVar3;
  return;
}

Assistant:

void csp_eth_arp_set_addr(uint8_t * mac_addr, uint16_t csp_addr)
{
    arp_list_entry_t * last_arp = 0;
    for (arp_list_entry_t * arp = arp_list; arp; arp = arp->next) {
        last_arp = arp;
        if (arp->csp_addr == csp_addr) {
            // Already set
            return;
        }
    }

    // Create and add a new ARP entry
    arp_list_entry_t * new_arp = arp_alloc();

    if (new_arp) {
        new_arp->csp_addr = csp_addr;
        memcpy(new_arp->mac_addr, mac_addr, CSP_ETH_ALEN);
        new_arp->next = 0;

        if (last_arp) {
            last_arp->next = new_arp;
        } else {
            arp_list = new_arp;
        }
    }

}